

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall project::get_module_list_abi_cxx11_(project *this)

{
  const_iterator pxVar1;
  const_iterator pxVar2;
  xpath_variable_set *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  xpath_node node;
  const_iterator it;
  xpath_node_set set;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  xpath_node *in_stack_ffffffffffffff08;
  xpath_node_set *in_stack_ffffffffffffff10;
  xml_node *in_stack_ffffffffffffff18;
  xml_attribute in_stack_ffffffffffffff20;
  char_t *in_stack_ffffffffffffff60;
  xml_node *in_stack_ffffffffffffff68;
  xml_attribute local_90;
  string local_88 [32];
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  const_iterator local_58;
  xpath_node_set local_40;
  byte local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x108eae);
  pugi::xml_node::select_nodes(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RSI);
  local_58 = pugi::xpath_node_set::begin(&local_40);
  while( true ) {
    pxVar1 = local_58;
    pxVar2 = pugi::xpath_node_set::end(&local_40);
    if (pxVar1 == pxVar2) break;
    local_68 = (local_58->_node)._root;
    pxStack_60 = (local_58->_attribute)._attr;
    pugi::xpath_node::node(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff20 =
         pugi::xml_node::attribute(in_stack_ffffffffffffff18,(char_t *)in_stack_ffffffffffffff10);
    local_90 = in_stack_ffffffffffffff20;
    in_stack_ffffffffffffff18 = (xml_node *)pugi::xml_attribute::value(&local_90);
    in_stack_ffffffffffffff10 = (xpath_node_set *)&stack0xffffffffffffff67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,(char *)in_stack_ffffffffffffff18,(allocator *)in_stack_ffffffffffffff10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    local_58 = local_58 + 1;
  }
  local_11 = 1;
  pugi::xpath_node_set::~xpath_node_set(in_stack_ffffffffffffff10);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff20._attr);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> project::get_module_list()
{
    std::vector<std::string> res;

    pugi::xpath_node_set set = m_Doc.select_nodes("/JUCERPROJECT/MODULES/MODULE");
    for (pugi::xpath_node_set::const_iterator it = set.begin(); it != set.end(); ++it)
    {
        pugi::xpath_node node = *it;
        res.push_back(node.node().attribute("id").value());
    }

    return res;
}